

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

lysp_feature * lysp_feature_find(lysp_module *pmod,char *name,size_t len,ly_bool prefixed)

{
  int iVar1;
  char *pcVar2;
  lys_module *plVar3;
  lysp_feature *last;
  uint32_t idx;
  
  idx = 0;
  if (pmod == (lysp_module *)0x0) {
    __assert_fail("pmod",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                  ,0xbd,
                  "struct lysp_feature *lysp_feature_find(const struct lysp_module *, const char *, size_t, ly_bool)"
                 );
  }
  if ((prefixed != '\0') && (pcVar2 = ly_strnchr(name,0x3a,len), pcVar2 != (char *)0x0)) {
    plVar3 = ly_resolve_prefix(pmod->mod->ctx,name,(long)pcVar2 - (long)name,LY_VALUE_SCHEMA,pmod);
    if (plVar3 == (lys_module *)0x0) {
      return (lysp_feature *)0x0;
    }
    pmod = plVar3->parsed;
    len = len + ~((long)pcVar2 - (long)name);
    name = pcVar2 + 1;
  }
  if ((pmod->field_0x79 & 2) != 0) {
    pmod = pmod->mod->parsed;
  }
  last = (lysp_feature *)0x0;
  do {
    last = lysp_feature_next(last,pmod,&idx);
    if (last == (lysp_feature *)0x0) {
      return (lysp_feature *)0x0;
    }
    iVar1 = ly_strncmp(last->name,name,len);
  } while (iVar1 != 0);
  return last;
}

Assistant:

static struct lysp_feature *
lysp_feature_find(const struct lysp_module *pmod, const char *name, size_t len, ly_bool prefixed)
{
    const struct lys_module *mod;
    const char *ptr;
    struct lysp_feature *f = NULL;
    uint32_t idx = 0;

    assert(pmod);

    if (prefixed && (ptr = ly_strnchr(name, ':', len))) {
        /* we have a prefixed feature */
        mod = ly_resolve_prefix(pmod->mod->ctx, name, ptr - name, LY_VALUE_SCHEMA, (void *)pmod);
        LY_CHECK_RET(!mod, NULL);

        pmod = mod->parsed;
        len = len - (ptr - name) - 1;
        name = ptr + 1;
    }

    /* feature without prefix, look in main module and all submodules */
    if (pmod->is_submod) {
        pmod = pmod->mod->parsed;
    }

    /* we have the correct module, get the feature */
    while ((f = lysp_feature_next(f, pmod, &idx))) {
        if (!ly_strncmp(f->name, name, len)) {
            return f;
        }
    }

    return NULL;
}